

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::rust::MultiCasePrefixStripper::MultiCasePrefixStripper
          (MultiCasePrefixStripper *this,string_view prefix)

{
  char *in_RCX;
  string_view input;
  string_view input_00;
  allocator<char> local_29;
  string *local_28;
  MultiCasePrefixStripper *local_20;
  MultiCasePrefixStripper *this_local;
  string_view prefix_local;
  
  prefix_local._M_len = (size_t)prefix._M_str;
  this_local = (MultiCasePrefixStripper *)prefix._M_len;
  local_28 = (string *)this;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_29);
  local_28 = (this->prefixes_)._M_elems + 1;
  input._M_str = in_RCX;
  input._M_len = prefix_local._M_len;
  ScreamingSnakeToUpperCamelCase_abi_cxx11_(local_28,(rust *)this_local,input);
  local_28 = (this->prefixes_)._M_elems + 2;
  input_00._M_str = in_RCX;
  input_00._M_len = prefix_local._M_len;
  CamelToSnakeCase_abi_cxx11_(local_28,(rust *)this_local,input_00);
  std::allocator<char>::~allocator(&local_29);
  return;
}

Assistant:

MultiCasePrefixStripper::MultiCasePrefixStripper(absl::string_view prefix)
    : prefixes_{
          std::string(prefix),
          ScreamingSnakeToUpperCamelCase(prefix),
          CamelToSnakeCase(prefix),
      } {}